

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int-view.h
# Opt level: O2

int __thiscall IntView<0>::getType(IntView<0> *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  
  uVar2 = this->a;
  bVar4 = (int)uVar2 < 0;
  if (bVar4) {
    uVar2 = -uVar2;
    this->a = uVar2;
  }
  uVar3 = (uint)bVar4;
  uVar1 = uVar3 + 2;
  if (uVar2 < 2) {
    uVar1 = uVar3;
  }
  uVar2 = uVar1 + 4;
  if (this->b == 0) {
    uVar2 = uVar1;
  }
  return uVar2;
}

Assistant:

int getType() {
		int t = 0;
		if (a < 0) {
			a = -a;
			t |= 1;
		}
		if (a > 1) {
			t |= 2;
		}
		if (b != 0) {
			t |= 4;
		}
		return t;
	}